

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

Handshake *
webfront::msg::MessageBase<webfront::msg::Handshake>::castFromRawData
          (span<const_std::byte,_18446744073709551615UL> data)

{
  size_type sVar1;
  runtime_error *prVar2;
  MessageBase<webfront::msg::Handshake> *this;
  size_t sVar3;
  Handshake *message;
  span<const_std::byte,_18446744073709551615UL> local_10;
  
  sVar1 = http::std::span<const_std::byte,_18446744073709551615UL>::size
                    ((span<const_std::byte,_18446744073709551615UL> *)0x13e968);
  if (sVar1 < 2) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Not enough data to form a message Header");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (MessageBase<webfront::msg::Handshake> *)
         http::std::span<const_std::byte,_18446744073709551615UL>::data(&local_10);
  sVar1 = http::std::span<const_std::byte,_18446744073709551615UL>::size
                    ((span<const_std::byte,_18446744073709551615UL> *)0x13e9df);
  sVar3 = getPayloadSize(this);
  if (sVar1 + sVar3 < 2) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Not enough data to form a complete message");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (Handshake *)this;
}

Assistant:

static const T* castFromRawData(std::span<const std::byte> data) {
        if (data.size() < sizeof(typename T::Header)) throw std::runtime_error("Not enough data to form a message Header");
        auto message = reinterpret_cast<const T*>(data.data());
        if ((data.size() + message->getPayloadSize()) < sizeof(typename T::Header))
            throw std::runtime_error("Not enough data to form a complete message");
        return message;
    }